

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O2

void pair_suite::test_string_bool(void)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  oarchive ar;
  ostringstream result;
  string local_230 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_210;
  basic_oarchive<char> local_1e8;
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  local_230[0] = (string)0x1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[6],_bool,_true>(&local_210,(char (*) [6])"alpha",(bool *)local_230);
  trial::protocol::json::basic_oarchive<char>::save_override<std::pair<std::__cxx11::string,bool>>
            (&local_1e8,&local_210);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[15]>
            ("result.str()","\"[\\\"alpha\\\",true]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x145,"void pair_suite::test_string_bool()",local_230,"[\"alpha\",true]");
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_210);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_string_bool()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::pair<std::string, bool> value("alpha", true);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[\"alpha\",true]");
}